

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequencer.h
# Opt level: O3

void __thiscall
disruptor::Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::BlockingStrategy,_0>::
Sequencer(Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::BlockingStrategy,_0> *this,
         size_t n)

{
  RingBuffer<long,_0>::RingBuffer(&this->ring_buffer_,n);
  (this->cursor_).sequence_.super___atomic_base<long>._M_i = -1;
  MultiThreadedStrategyEx::MultiThreadedStrategyEx(&this->claim_strategy_,n);
  *(undefined8 *)((long)&(this->wait_strategy_).mutex_.super___mutex_base._M_mutex + 0x10) = 0;
  (this->wait_strategy_).mutex_.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->wait_strategy_).mutex_.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->wait_strategy_).mutex_.super___mutex_base._M_mutex + 8) = 0;
  (this->wait_strategy_).mutex_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&(this->wait_strategy_).consumer_notify_condition_);
  (this->gating_sequences_).
  super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->gating_sequences_).
  super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->gating_sequences_).
  super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

Sequencer(size_t n) : ring_buffer_(n), claim_strategy_(n) {}